

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void non_empty_opendir_cb(uv_fs_t *req)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *unaff_RBX;
  uv_loop_t *puVar4;
  uv_fs_t *puVar5;
  code **ppcVar6;
  int64_t eval_b;
  int64_t eval_a;
  code *pcStack_38;
  undefined8 uStack_30;
  undefined1 auStack_28 [32];
  
  puVar4 = (uv_loop_t *)opendir_req.ptr;
  if (req == &opendir_req) {
    auStack_28._24_8_ = SEXT48(opendir_req.fs_type);
    auStack_28._16_8_ = 0x1f;
    if ((void *)auStack_28._24_8_ != (void *)0x1f) goto LAB_0018c802;
    auStack_28._24_8_ = opendir_req.result;
    auStack_28._16_8_ = 0;
    if (opendir_req.result != 0) goto LAB_0018c80f;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018c81c;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar4 + 8) = 1;
    auStack_28._8_8_ = (uv_loop_t *)0x18c7b2;
    uVar3 = uv_default_loop();
    auStack_28._8_8_ = (uv_loop_t *)0x18c7cb;
    iVar2 = uv_fs_readdir(uVar3,&readdir_req,puVar4,non_empty_readdir_cb);
    auStack_28._24_8_ = SEXT48(iVar2);
    auStack_28._16_8_ = 0;
    if ((void *)auStack_28._24_8_ == (void *)0x0) {
      auStack_28._8_8_ = (uv_loop_t *)0x18c7f1;
      uv_fs_req_cleanup(&opendir_req);
      non_empty_opendir_cb_count = non_empty_opendir_cb_count + 1;
      return;
    }
  }
  else {
    auStack_28._8_8_ = (uv_loop_t *)0x18c802;
    non_empty_opendir_cb_cold_1();
LAB_0018c802:
    auStack_28._8_8_ = (uv_loop_t *)0x18c80f;
    non_empty_opendir_cb_cold_2();
LAB_0018c80f:
    auStack_28._8_8_ = (uv_loop_t *)0x18c81c;
    non_empty_opendir_cb_cold_3();
    puVar4 = unaff_RBX;
LAB_0018c81c:
    auStack_28._8_8_ = (uv_loop_t *)0x18c821;
    non_empty_opendir_cb_cold_5();
  }
  puVar5 = (uv_fs_t *)(auStack_28 + 0x18);
  auStack_28._8_8_ = empty_readdir_cb;
  non_empty_opendir_cb_cold_4();
  pvVar1 = readdir_req.ptr;
  auStack_28._8_8_ = puVar4;
  if (puVar5 == &readdir_req) {
    auStack_28._0_8_ = SEXT48(readdir_req.fs_type);
    uStack_30 = 0x20;
    if ((void *)auStack_28._0_8_ != (void *)0x20) goto LAB_0018c8d7;
    auStack_28._0_8_ = readdir_req.result;
    uStack_30 = 0;
    if (readdir_req.result != 0) goto LAB_0018c8e4;
    pcStack_38 = (code *)0x18c894;
    uv_fs_req_cleanup(&readdir_req);
    pcStack_38 = (code *)0x18c899;
    uVar3 = uv_default_loop();
    pcStack_38 = (code *)0x18c8b2;
    iVar2 = uv_fs_closedir(uVar3,&closedir_req,pvVar1,empty_closedir_cb);
    auStack_28._0_8_ = SEXT48(iVar2);
    uStack_30 = 0;
    if ((void *)auStack_28._0_8_ == (void *)0x0) {
      return;
    }
  }
  else {
    pcStack_38 = (code *)0x18c8d7;
    empty_readdir_cb_cold_1();
LAB_0018c8d7:
    pcStack_38 = (code *)0x18c8e4;
    empty_readdir_cb_cold_2();
LAB_0018c8e4:
    pcStack_38 = (code *)0x18c8f1;
    empty_readdir_cb_cold_3();
  }
  puVar5 = (uv_fs_t *)auStack_28;
  pcStack_38 = empty_closedir_cb;
  empty_readdir_cb_cold_4();
  if (puVar5 == &closedir_req) {
    pcStack_38 = (code *)(long)closedir_req.fs_type;
    if (pcStack_38 == (code *)0x21) {
      pcStack_38 = (code *)closedir_req.result;
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_0018c97a;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_0018c97a:
  ppcVar6 = &pcStack_38;
  empty_closedir_cb_cold_3();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(ppcVar6,0);
  return;
}

Assistant:

static void non_empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_OK(req->result);
  ASSERT_NOT_NULL(req->ptr);

  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);

  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    non_empty_readdir_cb);
  ASSERT_OK(r);
  uv_fs_req_cleanup(req);
  ++non_empty_opendir_cb_count;
}